

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-watcher-cross-stop.c
# Opt level: O3

int run_test_watcher_cross_stop(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 *extraout_RDX;
  long lVar3;
  uv_udp_t *handle;
  sockaddr_in addr;
  char big_string [1024];
  uv_buf_t local_458;
  sockaddr_in local_448;
  rlimit64 local_438 [64];
  
  puVar2 = uv_default_loop();
  local_438[0].rlim_cur = 0x9e4;
  local_438[0].rlim_max = 0x9e4;
  iVar1 = setrlimit64(RLIMIT_NOFILE,local_438);
  if (iVar1 != 0) {
    run_test_watcher_cross_stop_cold_1();
    return 1;
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_448);
  if (iVar1 == 0) {
    memset(local_438,0x41,0x400);
    local_458 = uv_buf_init((char *)local_438,0x400);
    handle = sockets;
    lVar3 = 0;
    do {
      iVar1 = uv_udp_init(puVar2,handle);
      if (iVar1 != 0) {
LAB_001899a0:
        run_test_watcher_cross_stop_cold_3();
        goto LAB_001899a5;
      }
      iVar1 = uv_udp_bind(handle,(sockaddr *)&local_448,4);
      if (iVar1 != 0) {
LAB_0018999b:
        run_test_watcher_cross_stop_cold_4();
        goto LAB_001899a0;
      }
      iVar1 = uv_udp_recv_start(handle,alloc_cb,recv_cb);
      if (iVar1 != 0) {
LAB_00189996:
        run_test_watcher_cross_stop_cold_5();
        goto LAB_0018999b;
      }
      iVar1 = uv_udp_send((uv_udp_send_t *)((long)reqs[0].reserved + lVar3 + -0x10),handle,
                          &local_458,1,(sockaddr *)&local_448,send_cb);
      if (iVar1 != 0) {
        run_test_watcher_cross_stop_cold_6();
        goto LAB_00189996;
      }
      handle = handle + 1;
      lVar3 = lVar3 + 0x140;
    } while (lVar3 != 800000);
    while (recv_cb_called == 0) {
      uv_run(puVar2,UV_RUN_ONCE);
    }
    lVar3 = 0;
    do {
      uv_close((uv_handle_t *)((long)sockets[0].handle_queue + lVar3 + -0x20),close_cb);
      lVar3 = lVar3 + 0xd8;
    } while (lVar3 != 540000);
    if (recv_cb_called == 0) goto LAB_001899aa;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (send_cb_called != 0x9c4) goto LAB_001899af;
    if (close_cb_called == 0x9c4) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001899b9;
    }
  }
  else {
LAB_001899a5:
    run_test_watcher_cross_stop_cold_2();
LAB_001899aa:
    run_test_watcher_cross_stop_cold_10();
LAB_001899af:
    run_test_watcher_cross_stop_cold_7();
  }
  run_test_watcher_cross_stop_cold_8();
LAB_001899b9:
  run_test_watcher_cross_stop_cold_9();
  *extraout_RDX = slab;
  extraout_RDX[1] = 1;
  return 0x7422fc;
}

Assistant:

TEST_IMPL(watcher_cross_stop) {
#if defined(__MVS__)
  RETURN_SKIP("zOS does not allow address or port reuse when using UDP sockets");
#endif
  uv_loop_t* loop = uv_default_loop();
  unsigned int i;
  struct sockaddr_in addr;
  uv_buf_t buf;
  char big_string[1024];

  TEST_FILE_LIMIT(ARRAY_SIZE(sockets) + 32);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  memset(big_string, 'A', sizeof(big_string));
  buf = uv_buf_init(big_string, sizeof(big_string));

  for (i = 0; i < ARRAY_SIZE(sockets); i++) {
    ASSERT(0 == uv_udp_init(loop, &sockets[i]));
    ASSERT(0 == uv_udp_bind(&sockets[i],
                            (const struct sockaddr*) &addr,
                            UV_UDP_REUSEADDR));
    ASSERT(0 == uv_udp_recv_start(&sockets[i], alloc_cb, recv_cb));
    ASSERT(0 == uv_udp_send(&reqs[i],
                            &sockets[i],
                            &buf,
                            1,
                            (const struct sockaddr*) &addr,
                            send_cb));
  }

  while (recv_cb_called == 0)
    uv_run(loop, UV_RUN_ONCE);

  for (i = 0; i < ARRAY_SIZE(sockets); i++)
    uv_close((uv_handle_t*) &sockets[i], close_cb);

  ASSERT(recv_cb_called > 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(ARRAY_SIZE(sockets) == send_cb_called);
  ASSERT(ARRAY_SIZE(sockets) == close_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}